

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::ProcessTryFinally
          (InterpreterStackFrame *this,byte *ip,JumpOffset jumpOffset,RegSlot regException,
          RegSlot regOffset,bool hasYield)

{
  InterpreterStackFrame *pIVar1;
  short sVar2;
  byte bVar3;
  undefined8 *puVar4;
  code *pcVar5;
  bool bVar6;
  OpCode OVar7;
  uint byteOffset;
  int byteOffset_00;
  Var pvVar8;
  undefined4 *puVar9;
  OpLayoutBrLong *pOVar10;
  bool bVar11;
  LayoutSize local_34 [2];
  LayoutSize layoutSize;
  
  *(short *)(this + 0xdc) = *(short *)(this + 0xdc) + 1;
  *(ushort *)(this + 0xd4) = *(ushort *)(this + 0xd4) | 0x101;
  if (((byte)this[0xd6] & 4) != 0) {
    puVar4 = *(undefined8 **)(this + 0x30);
    *(undefined8 **)(this + 0x30) = puVar4 + 1;
    *puVar4 = *(undefined8 *)(this + 0x38);
    puVar4 = *(undefined8 **)(this + 0x30);
    *(undefined8 **)(this + 0x30) = puVar4 + 1;
    *puVar4 = *(undefined8 *)(this + 0x28);
    *(long *)(this + 0x38) = *(long *)(this + 0x30) + -0x10;
  }
  bVar3 = *(byte *)(*(long *)(*(long *)(this + 0x88) + 0x20) + 0xa8);
  if ((byte)((bVar3 & 0x40) >> 6 &
            (bVar3 >> 5 | *(long *)(*(long *)(*(long *)(this + 0x88) + 0x20) + 0x80) != 0)) == 1) {
    if (*(char *)(*(long *)(this + 0x78) + 0x143f) == '\x01') {
      pvVar8 = ProcessWithDebugging_PreviousStmtTracking(this);
    }
    else {
      pvVar8 = ProcessWithDebugging(this);
    }
  }
  else {
    pvVar8 = Process(this);
  }
  bVar11 = pvVar8 == (Var)0x0;
  if (bVar11 && !hasYield) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1c23,"(hasYield)","hasYield");
    if (!bVar6) goto LAB_00a48eb8;
    *puVar9 = 0;
  }
  pIVar1 = this + 0xdc;
  sVar2 = *(short *)pIVar1;
  *(short *)pIVar1 = *(short *)pIVar1 + -1;
  if (sVar2 == 0) {
    *(ushort *)(this + 0xd4) = *(ushort *)(this + 0xd4) & 0xfefe;
  }
  this[0xd6] = (InterpreterStackFrame)((byte)this[0xd6] & 0xfb | !bVar11 << 2);
  if (!bVar11) {
    byteOffset = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)this);
    if (hasYield) {
      *(undefined8 *)(this + (ulong)regException * 8 + 0x160) = 0;
      *(long *)(this + (ulong)regOffset * 8 + 0x160) = (long)(int)byteOffset;
    }
    ByteCodeReader::SetCurrentRelativeOffset((ByteCodeReader *)this,ip,(int)jumpOffset);
    RestoreSp(this);
    this[0xd4] = (InterpreterStackFrame)((byte)this[0xd4] | 4);
    OVar7 = ByteCodeReader::ReadOp((ByteCodeReader *)this,local_34);
    if (OVar7 == BrLong) {
      if (local_34[0] != SmallLayout) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                     ,0x1c62,"(layoutSize == SmallLayout)",
                                     "layoutSize == SmallLayout");
        if (!bVar11) goto LAB_00a48eb8;
        *puVar9 = 0;
      }
      pOVar10 = ByteCodeReader::BrLong((ByteCodeReader *)this);
      ByteCodeReader::SetCurrentRelativeOffset
                ((ByteCodeReader *)this,(byte *)(pOVar10 + 1),pOVar10->RelativeJumpOffset);
      OVar7 = ByteCodeReader::ReadOp((ByteCodeReader *)this,local_34);
    }
    if (OVar7 != Finally) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                   ,0x1c68,"(finallyOp == OpCode::Finally)",
                                   "Finally op not found at catch offset");
      if (!bVar11) {
LAB_00a48eb8:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar9 = 0;
    }
    byteOffset_00 = ProcessFinally(this);
    pIVar1 = this + 0xe4;
    sVar2 = *(short *)pIVar1;
    *(short *)pIVar1 = *(short *)pIVar1 + -1;
    if (sVar2 == 0) {
      this[0xd4] = (InterpreterStackFrame)((byte)this[0xd4] & 0xfb);
    }
    if (byteOffset_00 == 0) {
      ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this,byteOffset);
    }
    else {
      ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this,byteOffset_00);
    }
  }
  return;
}

Assistant:

void InterpreterStackFrame::ProcessTryFinally(const byte* ip, Js::JumpOffset jumpOffset, Js::RegSlot regException, Js::RegSlot regOffset, bool hasYield)
    {
        Js::JavascriptExceptionObject* pExceptionObject = nullptr;
        bool skipFinallyBlock = false;

        try
        {
            Js::Var result = nullptr;

            this->nestedTryDepth++;
            // mark the stackFrame as 'in try block'
            this->OrFlags(InterpreterStackFrameFlags_WithinTryBlock | InterpreterStackFrameFlags_WithinTryFinallyBlock);

            if (shouldCacheSP)
            {
                CacheSp();
            }

#ifdef ENABLE_SCRIPT_DEBUGGING
            if (this->IsInDebugMode())
            {
#if ENABLE_TTD
                if (SHOULD_DO_TTD_STACK_STMT_OP(this->scriptContext))
                {
                    result = this->ProcessWithDebugging_PreviousStmtTracking();
                }
                else
                {
                    result = this->ProcessWithDebugging();
                }
#else
                result = this->ProcessWithDebugging();
#endif
            }
            else
#endif
            {
                result = this->Process();
            }

            if (result == nullptr)
            {
                Assert(hasYield);
                skipFinallyBlock = true;
            }
        }
        catch (const Js::JavascriptException& err)
        {
            pExceptionObject = err.GetAndClear();
        }

        if (--this->nestedTryDepth == -1)
        {
            // unmark the stackFrame as 'in try block'
            this->ClearFlags(InterpreterStackFrameFlags_WithinTryBlock | InterpreterStackFrameFlags_WithinTryFinallyBlock);
        }

        shouldCacheSP = !skipFinallyBlock;

        if (skipFinallyBlock)
        {
            // A leave occurred due to a yield
            return;
        }

        // Save the current IP so execution can continue there if the finally doesn't
        // take control of the flow.
        int newOffset = 0;
        int currOffset = m_reader.GetCurrentOffset();
        if (hasYield)
        {
            // save the exception if there is one to a register in case we yield during the finally block
            // and need to get that exception object back upon resume in OP_ResumeFinally
            SetNonVarReg(regException, pExceptionObject);
            SetNonVarReg(regOffset, reinterpret_cast<Js::Var>(currOffset));
        }

        if (pExceptionObject)
        {
            // Clone static exception object early in case finally block overwrites it
            pExceptionObject = pExceptionObject->CloneIfStaticExceptionObject(scriptContext);
        }

#ifdef ENABLE_SCRIPT_DEBUGGING
        if (pExceptionObject && this->IsInDebugMode() &&
            pExceptionObject != scriptContext->GetThreadContext()->GetPendingSOErrorObject())
        {
            // Swallowing an exception that has triggered a finally is not implemented
            // (This appears to be the same behavior as ie8)
            pExceptionObject->SetDebuggerSkip(false);
        }
#endif

        // Call into the finally by setting the IP, consuming the Finally, and letting the interpreter recurse.
        m_reader.SetCurrentRelativeOffset(ip, jumpOffset);

        RestoreSp();
        // mark the stackFrame as 'in finally block'
        this->OrFlags(InterpreterStackFrameFlags_WithinFinallyBlock);

        LayoutSize layoutSize;
        OpCode finallyOp = m_reader.ReadOp(layoutSize);
#ifdef BYTECODE_BRANCH_ISLAND
        if (finallyOp == Js::OpCode::BrLong)
        {
            Assert(layoutSize == SmallLayout);
            auto playoutBrLong = m_reader.BrLong();
            m_reader.SetCurrentRelativeOffset((const byte *)(playoutBrLong + 1), playoutBrLong->RelativeJumpOffset);
            finallyOp = m_reader.ReadOp(layoutSize);
        }
#endif
        AssertMsg(finallyOp == OpCode::Finally, "Finally op not found at catch offset");

        newOffset = this->ProcessFinally();

        if (--this->nestedFinallyDepth == -1)
        {
            // unmark the stackFrame as 'in finally block'
            this->ClearFlags(InterpreterStackFrameFlags_WithinFinallyBlock);
        }

        bool endOfFinallyBlock = newOffset == 0;
        if (endOfFinallyBlock)
        {
            // Finally completed without taking over the flow. Resume where we left off before calling it.
            m_reader.SetCurrentOffset(currOffset);
        }
        else
        {
            // Finally seized the flow with a jump out of its scope. Resume at the jump target and
            // force the runtime to return to this frame without executing the catch.
            m_reader.SetCurrentOffset(newOffset);
            return;
        }

        if (pExceptionObject)
        {
            JavascriptExceptionOperators::DoThrow(pExceptionObject, scriptContext);
        }
    }